

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzCompress(bz_stream *strm,int action)

{
  bz_stream *strm_00;
  bz_stream *pbVar1;
  Bool BVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = -2;
  if (((strm != (bz_stream *)0x0) &&
      (strm_00 = (bz_stream *)strm->state, strm_00 != (bz_stream *)0x0)) &&
     (pbVar1 = (bz_stream *)strm_00->next_in, pbVar1 == strm)) {
    uVar3 = strm_00->avail_in;
    iVar4 = 0;
    while (uVar3 == 2) {
      uVar3 = 3;
      if (action != 1) {
        if (action != 2) {
          if (action != 0) {
            return -2;
          }
          BVar2 = handle_compress(strm_00);
          return (uint)(BVar2 != '\0') * 3 + -2;
        }
        uVar3 = 4;
      }
      strm_00->total_in_hi32 = strm->avail_in;
      strm_00->avail_in = uVar3;
    }
    if (uVar3 == 1) {
      iVar4 = -1;
    }
    else if (uVar3 == 3) {
      iVar4 = -1;
      if ((action == 1) && (strm_00->total_in_hi32 == pbVar1->avail_in)) {
        handle_compress(strm_00);
        iVar4 = 2;
        if (((strm_00->total_in_hi32 == 0) &&
            ((0xff < strm_00[1].total_in_lo32 || ((int)strm_00[1].total_in_hi32 < 1)))) &&
           ((int)strm_00[1].total_out_lo32 <= (int)strm_00[1].total_out_hi32)) {
          strm_00->avail_in = 2;
          iVar4 = 1;
        }
      }
    }
    else if ((((((uVar3 == 4) && (iVar4 = -1, action == 2)) &&
               (strm_00->total_in_hi32 == pbVar1->avail_in)) &&
              ((BVar2 = handle_compress(strm_00), BVar2 != '\0' &&
               (iVar4 = 3, strm_00->total_in_hi32 == 0)))) &&
             ((0xff < strm_00[1].total_in_lo32 || ((int)strm_00[1].total_in_hi32 < 1)))) &&
            ((int)strm_00[1].total_out_lo32 <= (int)strm_00[1].total_out_hi32)) {
      strm_00->avail_in = 1;
      iVar4 = 4;
    }
  }
  return iVar4;
}

Assistant:

int BZ_API(BZ2_bzCompress) ( bz_stream *strm, int action )
{
   Bool progress;
   EState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   preswitch:
   switch (s->mode) {

      case BZ_M_IDLE:
         return BZ_SEQUENCE_ERROR;

      case BZ_M_RUNNING:
         if (action == BZ_RUN) {
            progress = handle_compress ( strm );
            return progress ? BZ_RUN_OK : BZ_PARAM_ERROR;
         }
         else
         if (action == BZ_FLUSH) {
            s->avail_in_expect = strm->avail_in;
            s->mode = BZ_M_FLUSHING;
            goto preswitch;
         }
         else
         if (action == BZ_FINISH) {
            s->avail_in_expect = strm->avail_in;
            s->mode = BZ_M_FINISHING;
            goto preswitch;
         }
         else
            return BZ_PARAM_ERROR;

      case BZ_M_FLUSHING:
         if (action != BZ_FLUSH) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect != s->strm->avail_in)
            return BZ_SEQUENCE_ERROR;
         progress = handle_compress ( strm );
         if (s->avail_in_expect > 0 || !isempty_RL(s) ||
             s->state_out_pos < s->numZ) return BZ_FLUSH_OK;
         s->mode = BZ_M_RUNNING;
         return BZ_RUN_OK;

      case BZ_M_FINISHING:
         if (action != BZ_FINISH) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect != s->strm->avail_in)
            return BZ_SEQUENCE_ERROR;
         progress = handle_compress ( strm );
         if (!progress) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect > 0 || !isempty_RL(s) ||
             s->state_out_pos < s->numZ) return BZ_FINISH_OK;
         s->mode = BZ_M_IDLE;
         return BZ_STREAM_END;
   }
   return BZ_OK; /*--not reached--*/
}